

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  uint uVar1;
  string *psVar2;
  MaterialNode *pMVar3;
  void *pvVar4;
  iterator __position;
  pointer *ppTVar5;
  XMLLoader *pXVar6;
  int iVar7;
  mapped_type *pmVar8;
  TriangleMeshNode *this_00;
  undefined8 *in_RDX;
  ulong uVar9;
  long lVar10;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> triangles;
  size_t matid;
  undefined1 local_90 [8];
  __atomic_base<unsigned_long> local_88;
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_78;
  Vec3fa *local_70;
  anon_union_8_2_4062524c_for_Vec2<float>_1 *local_68;
  __atomic_base<unsigned_long> _Stack_60;
  element_type *local_58;
  undefined8 local_48;
  XMLLoader *local_40;
  _Alloc_hider local_38;
  
  psVar2 = (string *)*in_RDX;
  local_88._M_i = (__int_type)&_Stack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"materiallist","");
  XML::child((XML *)&stack0xffffffffffffff98,psVar2);
  iVar7 = Token::Int((Token *)local_68[0x13]);
  if (local_68 != (anon_union_8_2_4062524c_for_Vec2<float>_1 *)0x0) {
    (**(code **)((long)*local_68 + 0x18))();
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_88._M_i != &_Stack_78) {
    operator_delete((void *)local_88._M_i);
  }
  local_38._M_p = (pointer)(long)iVar7;
  pmVar8 = std::
           map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
           ::at((map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                 *)(xml + 0x12),(key_type *)&stack0xffffffffffffffc8);
  pMVar3 = pmVar8->ptr;
  if (pMVar3 != (MaterialNode *)0x0) {
    (*(pMVar3->super_Node).super_RefCount._vptr_RefCount[2])(pMVar3);
  }
  this_00 = (TriangleMeshNode *)operator_new(0xd8);
  local_48 = pMVar3;
  if (pMVar3 != (MaterialNode *)0x0) {
    (*(pMVar3->super_Node).super_RefCount._vptr_RefCount[2])(pMVar3);
  }
  SceneGraph::TriangleMeshNode::TriangleMeshNode
            (this_00,(Ref<embree::SceneGraph::MaterialNode> *)&stack0xffffffffffffffb8,
             (BBox1f)0x3f80000000000000,0);
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
  local_40 = this;
  if ((MaterialNode *)local_48 != (MaterialNode *)0x0) {
    (**(code **)(*(long *)local_48 + 0x18))();
  }
  psVar2 = (string *)*in_RDX;
  local_68 = (anon_union_8_2_4062524c_for_Vec2<float>_1 *)&stack0xffffffffffffffa8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff98,"vertex","");
  XML::childOpt((XML *)local_90,psVar2);
  loadVec3faArray((avector<Vec3fa> *)&local_88,(XMLLoader *)xml,(Ref<embree::XML> *)local_90);
  std::
  vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
  ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
            ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              *)&this_00->positions,
             (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)&local_88
            );
  alignedFree(local_70);
  local_80 = (element_type *)0x0;
  _Stack_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = (Vec3fa *)0x0;
  if (local_90 != (undefined1  [8])0x0) {
    (*((RefCount *)local_90)->_vptr_RefCount[3])();
  }
  if (local_68 != (anon_union_8_2_4062524c_for_Vec2<float>_1 *)&stack0xffffffffffffffa8) {
    operator_delete(local_68);
  }
  psVar2 = (string *)*in_RDX;
  local_68 = (anon_union_8_2_4062524c_for_Vec2<float>_1 *)&stack0xffffffffffffffa8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff98,"normal","");
  XML::childOpt((XML *)local_90,psVar2);
  loadVec3faArray((avector<Vec3fa> *)&local_88,(XMLLoader *)xml,(Ref<embree::XML> *)local_90);
  std::
  vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
  ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
            ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              *)&this_00->normals,
             (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)&local_88
            );
  alignedFree(local_70);
  local_80 = (element_type *)0x0;
  _Stack_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = (Vec3fa *)0x0;
  if (local_90 != (undefined1  [8])0x0) {
    (*((RefCount *)local_90)->_vptr_RefCount[3])();
  }
  if (local_68 != (anon_union_8_2_4062524c_for_Vec2<float>_1 *)&stack0xffffffffffffffa8) {
    operator_delete(local_68);
  }
  psVar2 = (string *)*in_RDX;
  local_88._M_i = (__int_type)&_Stack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"texcoord","");
  XML::childOpt((XML *)local_90,psVar2);
  loadVec2fArray((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                 &stack0xffffffffffffff98,(XMLLoader *)xml,(Ref<embree::XML> *)local_90);
  pvVar4 = (this_00->texcoords).
           super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this_00->texcoords).
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_68;
  (this_00->texcoords).
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)_Stack_60._M_i;
  (this_00->texcoords).
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_58;
  local_68 = (anon_union_8_2_4062524c_for_Vec2<float>_1 *)0x0;
  _Stack_60._M_i = 0;
  local_58 = (element_type *)0x0;
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4);
  }
  if (local_68 != (anon_union_8_2_4062524c_for_Vec2<float>_1 *)0x0) {
    operator_delete(local_68);
  }
  if (local_90 != (undefined1  [8])0x0) {
    (*((RefCount *)local_90)->_vptr_RefCount[3])();
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_88._M_i != &_Stack_78) {
    operator_delete((void *)local_88._M_i);
  }
  psVar2 = (string *)*in_RDX;
  local_88._M_i = (__int_type)&_Stack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"prim","");
  XML::childOpt((XML *)local_90,psVar2);
  loadVec4iArray((vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *)
                 &stack0xffffffffffffff98,(XMLLoader *)xml,(Ref<embree::XML> *)local_90);
  if (local_90 != (undefined1  [8])0x0) {
    (*((RefCount *)local_90)->_vptr_RefCount[3])();
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_88._M_i != &_Stack_78) {
    operator_delete((void *)local_88._M_i);
  }
  if ((anon_union_8_2_4062524c_for_Vec2<float>_1 *)_Stack_60._M_i != local_68) {
    lVar10 = 8;
    uVar9 = 0;
    do {
      uVar1 = *(uint *)((long)&(local_68->field_0).x + lVar10);
      local_88._M_i = *(__int_type *)((long)local_68 + lVar10 + -8);
      local_80 = (element_type *)CONCAT44(local_80._4_4_,uVar1);
      __position._M_current =
           (this_00->triangles).
           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->triangles).
          super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
        ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                  (&this_00->triangles,__position,(Triangle *)&local_88);
      }
      else {
        (__position._M_current)->v2 = uVar1;
        (__position._M_current)->v0 = (int)local_88._M_i;
        (__position._M_current)->v1 = (int)(local_88._M_i >> 0x20);
        ppTVar5 = &(this_00->triangles).
                   super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar5 = *ppTVar5 + 1;
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x10;
    } while (uVar9 < (ulong)((long)(_Stack_60._M_i - (long)local_68) >> 4));
  }
  pXVar6 = local_40;
  (local_40->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
  if (local_68 != (anon_union_8_2_4062524c_for_Vec2<float>_1 *)0x0) {
    operator_delete(local_68);
  }
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x18))(this_00);
  if (pMVar3 != (MaterialNode *)0x0) {
    (*(pMVar3->super_Node).super_RefCount._vptr_RefCount[3])(pMVar3);
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)pXVar6;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFMesh(const Ref<XML>& xml) 
  {
    size_t matid = xml->child("materiallist")->body[0].Int();
    Ref<SceneGraph::MaterialNode> material = id2material.at(matid);
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),0);

    mesh->positions.push_back(loadVec3faArray(xml->childOpt("vertex")));
    mesh->normals.push_back(loadVec3faArray(xml->childOpt("normal")));
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoord"));

    std::vector<Vec4i> triangles = loadVec4iArray(xml->childOpt("prim"));
    for (size_t i=0; i<triangles.size(); i++) 
      mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(triangles[i].x,triangles[i].y,triangles[i].z));

    return mesh.dynamicCast<SceneGraph::Node>();
  }